

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O1

void __thiscall icu_63::ICUService::~ICUService(ICUService *this)

{
  (this->super_ICUNotifier)._vptr_ICUNotifier = (_func_int **)&PTR__ICUService_003ddc10;
  umtx_lock_63((UMutex *)lock);
  (*(this->super_ICUNotifier)._vptr_ICUNotifier[0x12])(this);
  if (this->factories != (UVector *)0x0) {
    (*(this->factories->super_UObject)._vptr_UObject[1])();
  }
  this->factories = (UVector *)0x0;
  umtx_unlock_63((UMutex *)lock);
  UnicodeString::~UnicodeString(&this->name);
  ICUNotifier::~ICUNotifier(&this->super_ICUNotifier);
  return;
}

Assistant:

ICUService::~ICUService()
{
    {
        Mutex mutex(&lock);
        clearCaches();
        delete factories;
        factories = NULL;
    }
}